

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

bool __thiscall xray_re::xr_memory_writer::save_to(xr_memory_writer *this,char *path)

{
  pointer puVar1;
  xr_file_system *this_00;
  xr_writer *pxVar2;
  
  this_00 = xr_file_system::instance();
  pxVar2 = xr_file_system::w_open(this_00,path,false);
  if (pxVar2 != (xr_writer *)0x0) {
    puVar1 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (*pxVar2->_vptr_xr_writer[2])
              (pxVar2,puVar1,
               (long)(this->m_buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1);
    (*pxVar2->_vptr_xr_writer[1])(pxVar2);
  }
  return pxVar2 != (xr_writer *)0x0;
}

Assistant:

bool xr_memory_writer::save_to(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_writer* w = fs.w_open(path);
	if (w == 0)
		return false;
	w->w_raw(&m_buffer[0], m_buffer.size());
	fs.w_close(w);
	return true;
}